

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void faup_output_show_buffer
               (faup_handler_t *fh,faup_options_t *opts,faup_feature_t feature,char *buffer,
               int *buffer_pos,int escape_dquotes)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char *tmpbuf;
  uint32_t counter;
  int *buffer_pos_local;
  char *buffer_local;
  faup_options_t *opts_local;
  faup_handler_t *fh_local;
  int iStack_10;
  faup_feature_t feature_local;
  
  uVar3 = feature.size;
  iVar1 = faup_features_exist(feature);
  __stream = _stderr;
  if (iVar1 != 0) {
    tmpbuf._4_4_ = 0;
    pcVar2 = (fh->faup).org_str;
    iStack_10 = feature.pos;
    if (uVar3 < 0x2001) {
      for (; tmpbuf._4_4_ < uVar3; tmpbuf._4_4_ = tmpbuf._4_4_ + 1) {
        if ((escape_dquotes != 0) && (pcVar2[(ulong)tmpbuf._4_4_ + (long)iStack_10] == '\"')) {
          faup_output_buffer_append(buffer,buffer_pos,"\\",1);
        }
        faup_output_buffer_append
                  (buffer,buffer_pos,(fh->faup).org_str + (iStack_10 + tmpbuf._4_4_),1);
      }
    }
    else {
      pcVar2 = faup_features_get_field_name(feature);
      fprintf(__stream,
              "Error: field(%s) with size(%d) is greater than the maximum default FAUP URL MAXLEN (%d). Cannot process the given url (%s).\n"
              ,pcVar2,(ulong)uVar3,0x2000,(fh->faup).org_str);
    }
  }
  return;
}

Assistant:

void faup_output_show_buffer(faup_handler_t const* fh, faup_options_t *opts, const faup_feature_t feature, char *buffer, int *buffer_pos, int escape_dquotes)
{

	if (faup_features_exist(feature)) {
		uint32_t counter = 0;
		const char *tmpbuf = NULL;
		tmpbuf = &fh->faup.org_str[feature.pos];

		if (feature.size > FAUP_MAXLEN) {
			fprintf(stderr, "Error: field(%s) with size(%d) is greater than the maximum default FAUP URL MAXLEN (%d). Cannot process the given url (%s).\n",
				faup_features_get_field_name(feature), feature.size, FAUP_MAXLEN, fh->faup.org_str);
			return;
		}

		while (counter < feature.size) {
			if (escape_dquotes) {
				if (tmpbuf[counter] == '"') {
					faup_output_buffer_append(buffer, buffer_pos, "\\", 1);
				}
			}

			// printf("tmpbuf:%c\n", tmpbuf[counter]);
			faup_output_buffer_append(buffer, buffer_pos, &fh->faup.org_str[feature.pos+counter], 1);

			counter++;
		}

	}
}